

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_jumpRelativeIfFalse
               (sysbvm_bytecodeJit_t *jit,int16_t conditionOperand,size_t targetPC)

{
  sysbvm_bytecodeJitPCRelocation_t relocation_00;
  size_t sVar1;
  uint8_t instruction [6];
  sysbvm_bytecodeJitPCRelocation_t relocation;
  uint8_t local_40 [8];
  long local_38;
  size_t sStack_30;
  undefined8 local_28;
  
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,conditionOperand);
  local_38 = CONCAT26(local_38._6_2_,0x1f3d48);
  sysbvm_bytecodeJit_addBytes(jit,6,(uint8_t *)&local_38);
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[0] = '\x0f';
  local_40[1] = 0x85;
  local_40[2] = '\0';
  local_40[3] = '\0';
  sVar1 = sysbvm_bytecodeJit_addBytes(jit,6,local_40);
  local_38 = sVar1 - 4;
  local_28 = 0xfffffffffffffffc;
  relocation_00.targetPC = targetPC;
  relocation_00.offset = local_38;
  relocation_00.addend = -4;
  sStack_30 = targetPC;
  sysbvm_bytecodeJit_addPCRelocation(jit,relocation_00);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_jumpRelativeIfFalse(sysbvm_bytecodeJit_t *jit, int16_t conditionOperand, size_t targetPC)
{
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_RAX, conditionOperand);
    sysbvm_jit_x86_cmpRAXWithImmediate32(jit, SYSBVM_TRUE_TUPLE);

    uint8_t instruction[] = {
        // Jne
        0x0F, 0x85, 0x00, 0x00, 0x00, 0x00,
    };

    size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;
    sysbvm_bytecodeJitPCRelocation_t relocation = {
        .offset = relocationOffset,
        .targetPC = targetPC,
        .addend = -4,
    };
    sysbvm_bytecodeJit_addPCRelocation(jit, relocation);
}